

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegtran.c
# Opt level: O3

void select_transform(JXFORM_CODE transform)

{
  undefined8 *in_RSI;
  undefined4 in_register_0000003c;
  
  if (transformoption.transform == JXFORM_NONE || transformoption.transform == transform) {
    transformoption.transform = transform;
    return;
  }
  select_transform_cold_1();
  if (*(int *)(*(long *)CONCAT44(in_register_0000003c,transform) + 0x7c) != 0) {
    return;
  }
  *in_RSI = progress_monitor;
  in_RSI[4] = 0;
  in_RSI[5] = 0;
  *(undefined4 *)(in_RSI + 6) = 0xffffffff;
  *(undefined8 **)(CONCAT44(in_register_0000003c,transform) + 0x10) = in_RSI;
  return;
}

Assistant:

LOCAL(void)
select_transform(JXFORM_CODE transform)
/* Silly little routine to detect multiple transform options,
 * which we can't handle.
 */
{
#if TRANSFORMS_SUPPORTED
  if (transformoption.transform == JXFORM_NONE ||
      transformoption.transform == transform) {
    transformoption.transform = transform;
  } else {
    fprintf(stderr, "%s: can only do one image transformation at a time\n",
            progname);
    usage();
  }
#else
  fprintf(stderr, "%s: sorry, image transformation was not compiled\n",
          progname);
  exit(EXIT_FAILURE);
#endif
}